

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::EvaluateSectionFrame
          (ChElementBeamANCF_3333 *this,double xi,ChVector<double> *point,ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined8 in_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  ChVector<double> CrossSectionY;
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_compact;
  VectorN Sxi_eta_compact;
  Matrix3xN e_bar;
  undefined1 local_288 [16];
  ChVector<double> local_258;
  Matrix3xN *local_240;
  Matrix3xN *local_238;
  double *local_230;
  undefined8 local_220;
  double local_208;
  ChVector<double> local_1f8;
  VectorN local_1e0;
  undefined8 local_198;
  double local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  double local_160;
  undefined8 local_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double local_118;
  double dStack_110;
  Matrix3xN local_108;
  
  local_288._8_8_ = in_XMM0_Qb;
  local_288._0_8_ = xi;
  Calc_Sxi_compact(this,&local_1e0,xi,0.0,0.0);
  local_150 = xi + -0.5;
  auVar10._0_8_ = this->m_thicknessY;
  auVar10._8_8_ = this->m_thicknessZ;
  local_198 = 0;
  auVar6._8_8_ = 0x3fd0000000000000;
  auVar6._0_8_ = 0x3fd0000000000000;
  auVar5 = vmulpd_avx512vl(auVar10,auVar6);
  auVar6 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),local_288,ZEXT816(0x4000000000000000));
  local_178 = auVar5._0_8_;
  dStack_128 = auVar5._8_8_ * 0.0;
  local_148 = auVar6._0_8_ * local_178 * 0.0;
  dStack_140 = auVar6._0_8_ * dStack_128;
  local_138 = xi + 0.5;
  auVar6 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),local_288,ZEXT816(0x3ff0000000000000));
  local_130 = auVar6._0_8_ * local_178 * 0.0;
  dStack_128 = auVar6._0_8_ * dStack_128;
  local_120 = xi * -2.0;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar6 = vmulpd_avx512vl(auVar10,auVar5);
  local_118 = auVar6._0_8_ * xi;
  dStack_110 = auVar6._8_8_ * xi;
  auVar6 = vfmsub213sd_fma(local_288,local_288,local_288);
  local_190 = auVar6._0_8_ * local_178;
  auVar6 = vfmadd213sd_fma(local_288,local_288,local_288);
  auVar5 = vfnmadd213sd_fma(local_288,local_288,ZEXT816(0x3ff0000000000000));
  local_188 = 0;
  uStack_180 = 0;
  local_178 = auVar6._0_8_ * local_178;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = auVar5._0_8_ * (double)auVar10._0_8_ * 0.5;
  local_158 = 0;
  CalcCoordMatrix(this,&local_108);
  local_238 = (Matrix3xN *)&local_1e0;
  local_240 = &local_108;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
                    *)&local_240);
  local_208 = this->m_lenX;
  local_220 = 0x4000000000000000;
  local_238 = &local_108;
  local_230 = &local_150;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_1f8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_240,(type *)0x0);
  local_208 = this->m_thicknessY;
  local_220 = 0x4000000000000000;
  local_238 = &local_108;
  local_230 = (double *)&local_198;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_258,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_240,(type *)0x0);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_1f8.m_data[0];
  auVar9 = ZEXT816(0x3ff0000000000000);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_1f8.m_data[2];
  auVar8 = ZEXT816(0) << 0x40;
  if ((((local_1f8.m_data[0] != 0.0) || (NAN(local_1f8.m_data[0]))) || (local_1f8.m_data[1] != 0.0))
     || (NAN(local_1f8.m_data[1]))) {
LAB_0072583a:
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_1f8.m_data[1] * local_1f8.m_data[1];
    auVar10 = vfmadd231sd_fma(auVar31,auVar13,auVar13);
    auVar10 = vfmadd231sd_fma(auVar10,auVar26,auVar26);
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar29 = 1.0 / auVar10._0_8_;
    bVar4 = 2.2250738585072014e-308 <= auVar10._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)bVar4 * (long)(local_1f8.m_data[2] * dVar29);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)bVar4 * (long)(local_1f8.m_data[1] * dVar29);
    auVar9._0_8_ = (ulong)bVar4 * (long)(local_1f8.m_data[0] * dVar29) +
                   (ulong)!bVar4 * 0x3ff0000000000000;
    auVar9._8_8_ = 0;
  }
  else {
    auVar7 = ZEXT816(0) << 0x40;
    if ((local_1f8.m_data[2] != 0.0) || (NAN(local_1f8.m_data[2]))) goto LAB_0072583a;
  }
  dVar43 = auVar7._0_8_;
  dVar41 = auVar8._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_258.m_data[2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_258.m_data[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_258.m_data[1];
  dVar42 = auVar9._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar42 * local_258.m_data[2];
  auVar10 = vfmsub231sd_fma(auVar27,auVar7,auVar35);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar43 * local_258.m_data[1];
  auVar6 = vfmsub231sd_fma(auVar22,auVar8,auVar32);
  dVar29 = auVar6._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar41 * local_258.m_data[0];
  auVar5 = vfmsub231sd_fma(auVar14,auVar9,auVar34);
  dVar11 = auVar5._0_8_;
  dVar25 = auVar10._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar25 * dVar25;
  auVar10 = vfmadd231sd_fma(auVar38,auVar6,auVar6);
  auVar10 = vfmadd231sd_fma(auVar10,auVar5,auVar5);
  auVar10 = vsqrtsd_avx(auVar10,auVar10);
  dVar30 = auVar10._0_8_;
  if (dVar30 < 0.0001) {
    auVar1._8_8_ = 0x7fffffffffffffff;
    auVar1._0_8_ = 0x7fffffffffffffff;
    auVar10 = vandpd_avx512vl(auVar35,auVar1);
    if (0.9 <= auVar10._0_8_) {
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar10 = vandpd_avx512vl(auVar34,auVar2);
      if (0.9 <= auVar10._0_8_) {
        auVar3._8_8_ = 0x7fffffffffffffff;
        auVar3._0_8_ = 0x7fffffffffffffff;
        auVar10 = vandpd_avx512vl(auVar32,auVar3);
        auVar6 = ZEXT816(0);
        if (0.9 <= auVar10._0_8_) goto LAB_00725950;
        auVar10 = ZEXT816(0x3ff0000000000000);
      }
      else {
        auVar6 = ZEXT816(0x3ff0000000000000);
LAB_00725950:
        auVar10 = ZEXT816(0);
      }
      auVar5 = ZEXT816(0);
    }
    else {
      auVar5 = ZEXT816(0x3ff0000000000000);
      auVar10 = ZEXT816(0);
      auVar6 = ZEXT816(0);
    }
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar10._0_8_ * -dVar42;
    auVar13 = vfmadd231sd_fma(auVar28,auVar7,auVar5);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar6._0_8_ * -dVar43;
    auVar10 = vfmadd231sd_fma(auVar23,auVar8,auVar10);
    dVar29 = auVar10._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auVar5._0_8_ * -dVar41;
    auVar6 = vfmadd231sd_fma(auVar15,auVar9,auVar6);
    dVar11 = auVar6._0_8_;
    dVar25 = auVar13._0_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar25 * dVar25;
    auVar10 = vfmadd231sd_fma(auVar33,auVar10,auVar10);
    auVar10 = vfmadd231sd_fma(auVar10,auVar6,auVar6);
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar30 = auVar10._0_8_;
  }
  dVar30 = 1.0 / dVar30;
  dVar29 = dVar29 * dVar30;
  dVar11 = dVar11 * dVar30;
  dVar25 = dVar25 * dVar30;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar11;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar43 * dVar29;
  auVar10 = vfmsub231sd_fma(auVar24,auVar16,auVar9);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar41 * dVar11;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar25;
  auVar6 = vfmsub231sd_fma(auVar39,auVar40,auVar7);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar29;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar42 * dVar25;
  auVar5 = vfmsub231sd_fma(auVar45,auVar36,auVar8);
  dVar21 = auVar10._0_8_;
  dVar30 = dVar11 + dVar42 + dVar21;
  dVar37 = auVar6._0_8_;
  dVar44 = auVar5._0_8_;
  if (0.0 <= dVar30) {
    dVar30 = dVar30 + 1.0;
    if (dVar30 < 0.0) {
      dVar11 = sqrt(dVar30);
    }
    else {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar30;
      auVar10 = vsqrtsd_avx(auVar18,auVar18);
      dVar11 = auVar10._0_8_;
    }
    dVar21 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar30 = (dVar44 - dVar25) * dVar11;
    dVar42 = (dVar29 - dVar43) * dVar11;
    dVar11 = (dVar41 - dVar37) * dVar11;
    goto LAB_00725c3f;
  }
  if (dVar21 <= dVar42) {
    if (dVar42 < dVar11) goto LAB_00725a1e;
    dVar11 = ((dVar42 - dVar21) - dVar11) + 1.0;
    if (dVar11 < 0.0) {
      dVar12 = sqrt(dVar11);
    }
    else {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar11;
      auVar10 = vsqrtsd_avx(auVar20,auVar20);
      dVar12 = auVar10._0_8_;
    }
    dVar21 = dVar44 - dVar25;
    dVar30 = dVar12 * 0.5;
    dVar12 = 0.5 / dVar12;
    dVar42 = (dVar41 + dVar37) * dVar12;
    dVar11 = (dVar43 + dVar29) * dVar12;
  }
  else if (dVar21 < dVar11) {
LAB_00725a1e:
    dVar11 = ((dVar11 - dVar42) - dVar21) + 1.0;
    if (dVar11 < 0.0) {
      dVar12 = sqrt(dVar11);
    }
    else {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar11;
      auVar10 = vsqrtsd_avx(auVar19,auVar19);
      dVar12 = auVar10._0_8_;
    }
    dVar21 = dVar41 - dVar37;
    dVar11 = dVar12 * 0.5;
    dVar12 = 0.5 / dVar12;
    dVar30 = (dVar43 + dVar29) * dVar12;
    dVar42 = (dVar44 + dVar25) * dVar12;
  }
  else {
    dVar11 = ((dVar21 - dVar11) - dVar42) + 1.0;
    if (dVar11 < 0.0) {
      dVar12 = sqrt(dVar11);
    }
    else {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar11;
      auVar10 = vsqrtsd_avx(auVar17,auVar17);
      dVar12 = auVar10._0_8_;
    }
    dVar21 = dVar29 - dVar43;
    dVar42 = dVar12 * 0.5;
    dVar12 = 0.5 / dVar12;
    dVar11 = (dVar44 + dVar25) * dVar12;
    dVar30 = (dVar41 + dVar37) * dVar12;
  }
  dVar21 = dVar21 * dVar12;
LAB_00725c3f:
  rot->m_data[0] = dVar21;
  rot->m_data[1] = dVar30;
  rot->m_data[2] = dVar42;
  rot->m_data[3] = dVar11;
  return;
}

Assistant:

void ChElementBeamANCF_3333::EvaluateSectionFrame(const double xi, ChVector<>& point, ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> CrossSectionY = e_bar * Sxi_eta_compact * 2 / m_thicknessY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the beam axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the cross section Y direction
    ChMatrix33<> msect;
    msect.Set_A_Xdir(BeamAxisTangent, CrossSectionY);

    rot = msect.Get_A_quaternion();
}